

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  commentSAXFunc UNRECOVERED_JUMPTABLE;
  uint val;
  uint uVar2;
  xmlChar *pxVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  undefined4 extraout_var;
  int iVar6;
  xmlChar xVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  xmlChar *pxVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  long local_68;
  int rl;
  xmlParserCtxtPtr local_58;
  size_t local_50;
  int local_44;
  int ql;
  uint local_3c;
  ulong local_38;
  
  lVar15 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    lVar15 = 10000000;
  }
  pxVar4 = ctxt->input;
  pxVar12 = pxVar4->cur;
  if (*pxVar12 != '<') {
    return;
  }
  if (pxVar12[1] != '!') {
    return;
  }
  pxVar5 = pxVar12 + 2;
  pxVar4->cur = pxVar5;
  pxVar4->col = pxVar4->col + 2;
  xVar7 = pxVar12[2];
  if (xVar7 == '\0') {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    xVar7 = *pxVar5;
  }
  if (xVar7 != '-') {
    return;
  }
  if (pxVar5[1] != '-') {
    return;
  }
  pxVar4->cur = pxVar5 + 2;
  pxVar4->col = pxVar4->col + 2;
  if (pxVar5[2] == '\0') {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
  }
  if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar4 = ctxt->input;
  }
  pxVar12 = pxVar4->cur;
  xVar7 = *pxVar12;
  local_68 = 0;
  local_50 = 100;
  pxVar5 = (xmlChar *)0x0;
  local_58 = ctxt;
  do {
    if (xVar7 == '\n') {
      iVar6 = pxVar4->line;
      pxVar3 = pxVar12;
      do {
        iVar6 = iVar6 + 1;
        pxVar4->line = iVar6;
        pxVar4->col = 1;
        pxVar12 = pxVar3 + 1;
        pxVar1 = pxVar3 + 1;
        pxVar3 = pxVar12;
      } while (*pxVar1 == '\n');
    }
    while( true ) {
      while( true ) {
        iVar6 = pxVar4->col;
        while( true ) {
          for (; (xVar7 = *pxVar12, '-' < (char)xVar7 ||
                 (xVar7 == '\t' || (byte)(xVar7 - 0x20) < 0xd)); pxVar12 = pxVar12 + 1) {
            iVar6 = iVar6 + 1;
          }
          pxVar4->col = iVar6;
          if (*pxVar12 != '\n') break;
          iVar6 = pxVar4->line;
          do {
            iVar6 = iVar6 + 1;
            pxVar4->line = iVar6;
            pxVar4->col = 1;
            pxVar3 = pxVar12 + 1;
            pxVar12 = pxVar12 + 1;
          } while (*pxVar3 == '\n');
          iVar6 = 1;
        }
        uVar9 = (long)pxVar12 - (long)pxVar4->cur;
        if (uVar9 != 0) {
          if ((ulong)(lVar15 - local_68) < uVar9) {
            xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",
                              (xmlChar *)0x0);
            goto LAB_00136324;
          }
          if (pxVar5 == (xmlChar *)0x0) {
            if ((*pxVar12 != '-') || (lVar10 = 1, pxVar12[1] != '-')) {
              lVar10 = 100;
            }
            local_50 = lVar10 + uVar9;
            pxVar3 = (xmlChar *)(*xmlMalloc)(local_50);
            if (pxVar3 == (xmlChar *)0x0) {
              xmlCtxtErrMemory(ctxt);
              return;
            }
            local_68 = 0;
          }
          else {
            pxVar3 = pxVar5;
            if (local_50 <= local_68 + 1 + uVar9) {
              local_50 = local_50 + 100 + uVar9 + local_68;
              pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar5,local_50);
              if (pxVar3 == (xmlChar *)0x0) {
                xmlCtxtErrMemory(local_58);
                goto LAB_00136324;
              }
            }
          }
          ctxt = local_58;
          memcpy(pxVar3 + local_68,local_58->input->cur,uVar9);
          local_68 = local_68 + uVar9;
          pxVar3[local_68] = '\0';
          pxVar4 = ctxt->input;
          pxVar5 = pxVar3;
        }
        pxVar4->cur = pxVar12;
        xVar7 = *pxVar12;
        if (xVar7 == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
          xVar7 = pxVar12[1];
          pxVar12 = pxVar12 + 1;
        }
        if ((xVar7 != '\r') || (pxVar12[1] != '\n')) break;
        pxVar4->cur = pxVar12 + 1;
        pxVar12 = pxVar12 + 2;
        pxVar4->line = pxVar4->line + 1;
        pxVar4->col = 1;
      }
      uVar11 = pxVar4->flags;
      if ((uVar11 & 0x40) == 0) {
        xmlParserShrink(ctxt);
        pxVar4 = ctxt->input;
        uVar11 = pxVar4->flags;
      }
      if (((uVar11 & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
        xmlParserGrow(ctxt);
        pxVar4 = ctxt->input;
      }
      pxVar12 = pxVar4->cur;
      xVar7 = *pxVar12;
      if (xVar7 != '-') break;
      if (pxVar12[1] == '-') {
        if (pxVar12[2] == '>') {
          pxVar4->cur = pxVar12 + 3;
          pxVar4->col = pxVar4->col + 3;
          if (pxVar12[3] == '\0') {
            xmlParserGrow(ctxt);
          }
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
              (UNRECOVERED_JUMPTABLE = ctxt->sax->comment,
              UNRECOVERED_JUMPTABLE == (commentSAXFunc)0x0)) || (ctxt->disableSAX != 0)) {
            if (pxVar5 == (xmlChar *)0x0) {
              return;
            }
          }
          else {
            if (pxVar5 == (xmlChar *)0x0) {
              (*UNRECOVERED_JUMPTABLE)(ctxt->userData,"");
              return;
            }
            (*UNRECOVERED_JUMPTABLE)(ctxt->userData,pxVar5);
          }
LAB_00136324:
          (*xmlFree)(pxVar5);
          return;
        }
        if (pxVar5 == (xmlChar *)0x0) {
          pcVar8 = "Double hyphen within comment\n";
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          pcVar8 = "Double hyphen within comment: <!--%.50s\n";
          pxVar3 = pxVar5;
        }
        xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,pcVar8,pxVar3);
        pxVar12 = pxVar12 + 1;
        pxVar4 = ctxt->input;
        iVar6 = pxVar4->col + 1;
        pxVar4->col = iVar6;
      }
      else {
        iVar6 = pxVar4->col;
      }
      pxVar12 = pxVar12 + 1;
      pxVar4->col = iVar6 + 1;
    }
  } while ((byte)(xVar7 - 9) < 2 || '\x1f' < (char)xVar7);
  uVar11 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar11 = 10000000;
  }
  if (pxVar5 == (xmlChar *)0x0) {
    local_50 = 100;
    pxVar5 = (xmlChar *)(*xmlMalloc)(100);
    if (pxVar5 == (xmlChar *)0x0) {
      xmlCtxtErrMemory(ctxt);
      return;
    }
    local_68 = 0;
  }
  val = xmlCurrentCharRecover(ctxt,&ql);
  if (val == 0) {
LAB_00136642:
    pcVar8 = "Comment not terminated\n";
    pxVar12 = pxVar5;
LAB_00136649:
    pxVar5 = (xmlChar *)0x0;
LAB_00136651:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,pcVar8,pxVar5);
    pxVar5 = pxVar12;
  }
  else {
    uVar2 = val;
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0)))) {
LAB_001362a1:
        pxVar4 = ctxt->input;
        if (*pxVar4->cur == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
        }
        else {
          pxVar4->col = pxVar4->col + 1;
        }
        pxVar4->cur = pxVar4->cur + ql;
        uVar2 = xmlCurrentCharRecover(ctxt,&rl);
        if (uVar2 == 0) goto LAB_00136642;
        if ((int)uVar2 < 0x100) {
          if ((0x1f < (int)uVar2) || ((uVar2 < 0xe && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)))) {
LAB_00136416:
            pxVar4 = ctxt->input;
            if (*pxVar4->cur == '\n') {
              pxVar4->line = pxVar4->line + 1;
              pxVar4->col = 1;
            }
            else {
              pxVar4->col = pxVar4->col + 1;
            }
            pxVar4->cur = pxVar4->cur + rl;
            iVar6 = xmlCurrentCharRecover(ctxt,&local_44);
            uVar9 = CONCAT44(extraout_var,iVar6);
            if (iVar6 != 0) {
              do {
                local_3c = uVar11;
                uVar11 = (uint)uVar9;
                pxVar12 = pxVar5;
                if ((int)uVar11 < 0x100) {
                  if (((int)uVar11 < 0x20) &&
                     ((0xd < uVar11 || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0)))) {
                    pxVar5[local_68] = '\0';
                    if (uVar11 != 0) {
LAB_001366c3:
                      xmlFatalErrMsgInt(local_58,XML_ERR_INVALID_CHAR,
                                        "xmlParseComment: invalid xmlChar value %d\n",uVar11);
                      goto LAB_00136660;
                    }
                    pcVar8 = "Comment not terminated \n<!--%.50s\n";
                    ctxt = local_58;
                    goto LAB_00136651;
                  }
                }
                else if (0xfffff < uVar11 - 0x10000 && (0x1ffd < uVar11 - 0xe000 && 0xd7ff < uVar11)
                        ) {
                  pxVar5[local_68] = '\0';
                  goto LAB_001366c3;
                }
                if (((val == 0x2d) && (uVar2 == 0x2d)) && (uVar11 == 0x3e)) {
                  pxVar5[local_68] = '\0';
                  xmlNextChar(ctxt);
                  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                      (UNRECOVERED_JUMPTABLE = ctxt->sax->comment,
                      UNRECOVERED_JUMPTABLE != (commentSAXFunc)0x0)) && (local_58->disableSAX == 0))
                  {
                    (*UNRECOVERED_JUMPTABLE)(local_58->userData,pxVar5);
                  }
                  goto LAB_00136660;
                }
                if (val == 0x2d && uVar2 == 0x2d) {
                  xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
                }
                sVar13 = local_50;
                uVar14 = uVar9;
                if (local_50 <= local_68 + 5U) {
                  sVar13 = 1;
                  iVar6 = (int)local_50;
                  local_38 = uVar9;
                  if (0 < iVar6) {
                    if ((int)local_3c <= iVar6) {
                      pcVar8 = "Comment too big found";
                      goto LAB_00136649;
                    }
                    uVar11 = iVar6 + 1U >> 1;
                    sVar13 = (size_t)(uVar11 + iVar6);
                    if ((int)(local_3c - uVar11) < iVar6) {
                      sVar13 = (size_t)local_3c;
                    }
                  }
                  pxVar12 = (xmlChar *)(*xmlRealloc)(pxVar5,sVar13);
                  uVar14 = local_38;
                  if (pxVar12 == (xmlChar *)0x0) goto LAB_001366df;
                }
                local_50 = sVar13;
                if (val < 0x80) {
                  pxVar12[local_68] = (xmlChar)val;
                  local_68 = local_68 + 1;
                }
                else {
                  iVar6 = xmlCopyCharMultiByte(pxVar12 + local_68,val);
                  local_68 = local_68 + iVar6;
                }
                ql = rl;
                rl = local_44;
                pxVar4 = ctxt->input;
                if (*pxVar4->cur == '\n') {
                  pxVar4->line = pxVar4->line + 1;
                  pxVar4->col = 1;
                }
                else {
                  pxVar4->col = pxVar4->col + 1;
                }
                pxVar4->cur = pxVar4->cur + local_44;
                uVar11 = xmlCurrentCharRecover(ctxt,&local_44);
                uVar9 = (ulong)uVar11;
                pxVar5 = pxVar12;
                val = uVar2;
                uVar2 = (uint)uVar14;
                uVar11 = local_3c;
              } while( true );
            }
            goto LAB_00136642;
          }
        }
        else if (uVar2 - 0x10000 < 0x100000 || (uVar2 - 0xe000 < 0x1ffe || uVar2 < 0xd800))
        goto LAB_00136416;
      }
    }
    else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) goto LAB_001362a1;
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",uVar2)
    ;
  }
LAB_00136660:
  (*xmlFree)(pxVar5);
  return;
LAB_001366df:
  xmlCtxtErrMemory(ctxt);
  goto LAB_00136660;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);
    if ((RAW != '-') || (NXT(1) != '-'))
        return;
    SKIP(2);
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
            if (nbchar > maxLength - len) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                                  "Comment too big found", NULL);
                xmlFree(buf);
                return;
            }
            if (buf == NULL) {
                if ((*in == '-') && (in[1] == '-'))
                    size = nbchar + 1;
                else
                    size = XML_PARSER_BUFFER_SIZE + nbchar;
                buf = xmlMalloc(size);
                if (buf == NULL) {
                    xmlErrMemory(ctxt);
                    return;
                }
                len = 0;
            } else if (len + nbchar + 1 >= size) {
                xmlChar *new_buf;
                size += len + nbchar + XML_PARSER_BUFFER_SIZE;
                new_buf = xmlRealloc(buf, size);
                if (new_buf == NULL) {
                    xmlErrMemory(ctxt);
                    xmlFree(buf);
                    return;
                }
                buf = new_buf;
            }
            memcpy(&buf[len], ctxt->input->cur, nbchar);
            len += nbchar;
            buf[len] = 0;
	}
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
}